

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall DiceRoller::DiceRoller(DiceRoller *this,DiceRoller *toCopy)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->diceRolled = piVar1;
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->history = this_00;
  *piVar1 = *toCopy->diceRolled;
  std::vector<int,_std::allocator<int>_>::operator=(this_00,toCopy->history);
  return;
}

Assistant:

DiceRoller::DiceRoller(const DiceRoller &toCopy) {
    diceRolled = new int();
    history = new vector<int>;
    *diceRolled = *toCopy.diceRolled;
    *history = *toCopy.history;
}